

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

char * Acb_DeriveOnePatchFunction
                 (Cnf_Dat_t *pCnf,int iTar,int nTargets,int nCoDivs,Vec_Int_t *vUsed,int fCisOnly)

{
  int iVar1;
  int iVar2;
  int iVar3;
  sat_solver *s;
  sat_solver *pSat;
  int Index;
  int iCoVarBeg;
  int iCiVarBeg;
  int Lit;
  int i;
  Vec_Str_t *vTempSop;
  Vec_Int_t *vTempLits;
  char *pSop;
  Vec_Int_t *pVStack_30;
  int fCisOnly_local;
  Vec_Int_t *vUsed_local;
  int local_20;
  int nCoDivs_local;
  int nTargets_local;
  int iTar_local;
  Cnf_Dat_t *pCnf_local;
  
  vTempLits = (Vec_Int_t *)0x0;
  pSop._4_4_ = fCisOnly;
  pVStack_30 = vUsed;
  vUsed_local._4_4_ = nCoDivs;
  local_20 = nTargets;
  nCoDivs_local = iTar;
  _nTargets_local = pCnf;
  iVar1 = Vec_IntSize(vUsed);
  vTempSop = (Vec_Str_t *)Vec_IntAlloc(iVar1 + 1);
  _Lit = Vec_StrAlloc(0);
  iVar2 = _nTargets_local->nVars - local_20;
  iVar1 = Vec_IntSize(pVStack_30);
  iVar2 = iVar2 - iVar1;
  s = sat_solver_new();
  sat_solver_setnvars(s,_nTargets_local->nVars + 1);
  iCiVarBeg = 0;
  while( true ) {
    if (_nTargets_local->nClauses <= iCiVarBeg) {
      iCoVarBeg = Abc_Var2Lit(1,0);
      iVar1 = sat_solver_addclause(s,&iCoVarBeg,&iCiVarBeg);
      if (iVar1 == 0) {
        pCnf_local = (Cnf_Dat_t *)0x0;
      }
      else {
        if (pSop._4_4_ == 0) {
          for (iCiVarBeg = 0; iVar1 = iCiVarBeg, iVar3 = Vec_IntSize(pVStack_30), iVar1 < iVar3;
              iCiVarBeg = iCiVarBeg + 1) {
            iVar1 = Vec_IntEntry(pVStack_30,iCiVarBeg);
            Vec_IntWriteEntry(pVStack_30,iCiVarBeg,iVar1 + 2);
          }
        }
        else {
          for (iCiVarBeg = 0; iVar1 = iCiVarBeg, iVar3 = Vec_IntSize(pVStack_30), iVar1 < iVar3;
              iCiVarBeg = iCiVarBeg + 1) {
            iVar1 = Vec_IntEntry(pVStack_30,iCiVarBeg);
            Vec_IntWriteEntry(pVStack_30,iCiVarBeg,iVar2 + iVar1);
          }
        }
        vTempLits = (Vec_Int_t *)
                    Acb_EnumerateSatAssigns
                              (s,(_nTargets_local->nVars - local_20) + nCoDivs_local,
                               _nTargets_local->nVars,pVStack_30,(Vec_Int_t *)vTempSop,_Lit);
        Vec_IntFree((Vec_Int_t *)vTempSop);
        Vec_StrFree(_Lit);
        sat_solver_delete(s);
        if (vTempLits == (Vec_Int_t *)0x0) {
          pCnf_local = (Cnf_Dat_t *)0x0;
        }
        else {
          if (pSop._4_4_ == 0) {
            for (iCiVarBeg = 0; iVar1 = iCiVarBeg, iVar2 = Vec_IntSize(pVStack_30), iVar1 < iVar2;
                iCiVarBeg = iCiVarBeg + 1) {
              iVar1 = Vec_IntEntry(pVStack_30,iCiVarBeg);
              Vec_IntWriteEntry(pVStack_30,iCiVarBeg,iVar1 + -2);
            }
          }
          else {
            for (iCiVarBeg = 0; iVar1 = iCiVarBeg, iVar3 = Vec_IntSize(pVStack_30), iVar1 < iVar3;
                iCiVarBeg = iCiVarBeg + 1) {
              iVar1 = Vec_IntEntry(pVStack_30,iCiVarBeg);
              Vec_IntWriteEntry(pVStack_30,iCiVarBeg,iVar1 - iVar2);
            }
          }
          pCnf_local = (Cnf_Dat_t *)vTempLits;
        }
      }
      return (char *)pCnf_local;
    }
    iVar1 = sat_solver_addclause
                      (s,_nTargets_local->pClauses[iCiVarBeg],
                       _nTargets_local->pClauses[iCiVarBeg + 1]);
    if (iVar1 == 0) break;
    iCiVarBeg = iCiVarBeg + 1;
  }
  return (char *)0x0;
}

Assistant:

char * Acb_DeriveOnePatchFunction( Cnf_Dat_t * pCnf, int iTar, int nTargets, int nCoDivs, Vec_Int_t * vUsed, int fCisOnly )
{
    char * pSop = NULL;
    Vec_Int_t * vTempLits = Vec_IntAlloc( Vec_IntSize(vUsed)+1 );
    Vec_Str_t * vTempSop = Vec_StrAlloc(0);
    int i, Lit;
    int iCiVarBeg = pCnf->nVars - nTargets - Vec_IntSize(vUsed);
    int iCoVarBeg = 1, Index;
    sat_solver * pSat = sat_solver_new(); 
    sat_solver_setnvars( pSat, pCnf->nVars + 1 );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // remap vUsed to be in terms of divisor variables
    if ( fCisOnly )
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, iCiVarBeg + Index );
    }
    else
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, iCoVarBeg + 1 + Index );
    }
    // enumerate assignments for each target in terms of used divisors
    pSop = Acb_EnumerateSatAssigns( pSat, pCnf->nVars - nTargets + iTar, pCnf->nVars, vUsed, vTempLits, vTempSop );
    Vec_IntFree( vTempLits );
    Vec_StrFree( vTempSop );
    sat_solver_delete( pSat );
    if ( pSop == NULL )
        return NULL;
    //printf( "Function %d:\n%s", i, pSop );
    // remap vUsed to be in terms of original divisors
    if ( fCisOnly )
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, Index - iCiVarBeg );
    }
    else
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, Index - (iCoVarBeg + 1) );
    }
    return pSop;
}